

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O1

void qclab::printMatrix4x4<qclab::dense::SquareMatrix<std::complex<float>>>
               (SquareMatrix<std::complex<float>_> *mat)

{
  complex<float> cVar1;
  
  if (mat->size_ == 4) {
    print<float>((complex<float>)mat);
    print<float>((complex<float>)mat);
    print<float>((complex<float>)mat);
    print<float>((complex<float>)mat);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    cVar1._M_value = std::ostream::put('h');
    std::ostream::flush();
    print<float>(cVar1);
    print<float>(cVar1);
    print<float>(cVar1);
    print<float>(cVar1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    cVar1._M_value = std::ostream::put('h');
    std::ostream::flush();
    print<float>(cVar1);
    print<float>(cVar1);
    print<float>(cVar1);
    print<float>(cVar1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    cVar1._M_value = std::ostream::put('h');
    std::ostream::flush();
    print<float>(cVar1);
    print<float>(cVar1);
    print<float>(cVar1);
    print<float>(cVar1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    return;
  }
  __assert_fail("mat.rows() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/util.hpp"
                ,0x6a,
                "void qclab::printMatrix4x4(const T &) [T = qclab::dense::SquareMatrix<std::complex<float>>]"
               );
}

Assistant:

void printMatrix4x4( const T& mat ) {
    assert( mat.rows() == 4 ) ;
    assert( mat.cols() == 4 ) ;
    print( mat(0,0) ); print( mat(0,1) ); print( mat(0,2) ); print( mat(0,3) );
    std::cout << std::endl ;
    print( mat(1,0) ); print( mat(1,1) ); print( mat(1,2) ); print( mat(1,3) );
    std::cout << std::endl ;
    print( mat(2,0) ); print( mat(2,1) ); print( mat(2,2) ); print( mat(2,3) );
    std::cout << std::endl ;
    print( mat(3,0) ); print( mat(3,1) ); print( mat(3,2) ); print( mat(3,3) );
    std::cout << std::endl ;
  }